

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_move.cpp
# Opt level: O3

void __thiscall DBot::TurnToAng(DBot *this)

{
  double dVar1;
  player_t *ppVar2;
  AActor *pAVar3;
  AActor *pAVar4;
  APlayerPawn *pAVar5;
  bool bVar6;
  AWeapon *pAVar7;
  double dVar8;
  double dVar9;
  DAngle local_10;
  
  ppVar2 = this->player;
  pAVar7 = ppVar2->ReadyWeapon;
  dVar9 = 15.0;
  if (pAVar7 != (AWeapon *)0x0) {
    if ((((pAVar7->super_AInventory).field_0x4df & 0x40) != 0) && (this->t_roam != 0)) {
      pAVar3 = (this->missile).field_0.p;
      if (pAVar3 == (AActor *)0x0) {
        return;
      }
      if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
        (this->missile).field_0.p = (AActor *)0x0;
        return;
      }
    }
    pAVar3 = (this->enemy).field_0.p;
    if (pAVar3 != (AActor *)0x0) {
      if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        pAVar4 = (this->dest).field_0.p;
        if (pAVar4 != (AActor *)0x0) {
          if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_0049f411;
          (this->dest).field_0.p = (AActor *)0x0;
          pAVar7 = ppVar2->ReadyWeapon;
        }
        if ((pAVar7->ProjectileType == (PClassActor *)0x0) &&
           (((pAVar7->super_AInventory).field_0x4dd & 0x80) == 0)) {
          local_10.Degrees = 65.0;
          bVar6 = Check_LOS(this,pAVar3,&local_10);
          dVar9 = 15.0;
          if (bVar6) {
            dVar9 = 3.0;
          }
        }
      }
      else {
        (this->enemy).field_0.p = (AActor *)0x0;
      }
    }
  }
LAB_0049f411:
  pAVar5 = this->player->mo;
  dVar1 = (pAVar5->super_AActor).Angles.Yaw.Degrees;
  dVar8 = (double)SUB84(((this->Angle).Degrees - dVar1) * 11930464.711111112 + 6755399441055744.0,0)
          * 8.381903171539307e-08;
  if (ABS(dVar8) < 5.0) {
    pAVar3 = (this->enemy).field_0.p;
    if (pAVar3 == (AActor *)0x0) {
      return;
    }
    if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (this->enemy).field_0.p = (AActor *)0x0;
      return;
    }
  }
  dVar8 = dVar8 / 3.0;
  if (dVar9 < ABS(dVar8)) {
    dVar8 = (double)(~-(ulong)(dVar8 < 0.0) & (ulong)dVar9 | (ulong)-dVar9 & -(ulong)(dVar8 < 0.0));
  }
  (pAVar5->super_AActor).Angles.Yaw.Degrees = dVar8 + dVar1;
  return;
}

Assistant:

void DBot::TurnToAng ()
{
    double maxturn = MAXTURN;

	if (player->ReadyWeapon != NULL)
	{
		if (player->ReadyWeapon->WeaponFlags & WIF_BOT_EXPLOSIVE)
		{
			if (t_roam && !missile)
			{ //Keep angle that where when shot where decided.
				return;
			}
		}


		if(enemy)
			if(!dest) //happens when running after item in combat situations, or normal, prevents weak turns
				if(player->ReadyWeapon->ProjectileType == NULL && !(player->ReadyWeapon->WeaponFlags & WIF_MELEEWEAPON))
					if(Check_LOS(enemy, SHOOTFOV+5))
						maxturn = 3;
	}

	DAngle distance = deltaangle(player->mo->Angles.Yaw, Angle);

	if (fabs (distance) < OKAYRANGE && !enemy)
		return;

	distance /= TURNSENS;
	if (fabs (distance) > maxturn)
		distance = distance < 0 ? -maxturn : maxturn;

	player->mo->Angles.Yaw += distance;
}